

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lite_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_0::LiteTest_DownCastMessageInvalidPointerType_Test::TestBody
          (LiteTest_DownCastMessageInvalidPointerType_Test *this)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  TestPackedTypesLite *this_00;
  char *message;
  AlphaNum *in_R9;
  string_view pc;
  AssertHelper local_4e0;
  Message local_4d8;
  int local_4cc;
  exception *gtest_exception;
  ReturnSentinel gtest_sentinel;
  unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>
  gtest_dt_ptr;
  AlphaNum local_480;
  AlphaNum local_450;
  string_view local_420;
  AlphaNum local_410;
  AlphaNum local_3e0;
  string local_3b0;
  Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_390;
  pointer local_378;
  DeathTest *gtest_dt;
  TestAllTypesLite *local_360;
  MessageLite *test_type_1_pointer;
  CastType1 test_type_1;
  LiteTest_DownCastMessageInvalidPointerType_Test *this_local;
  
  test_type_1.field_0._816_8_ = this;
  proto2_unittest::TestAllTypesLite::TestAllTypesLite((TestAllTypesLite *)&test_type_1_pointer);
  local_360 = (TestAllTypesLite *)&test_type_1_pointer;
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    absl::lts_20250127::AlphaNum::AlphaNum(&local_3e0,"Cannot downcast ");
    local_420 = MessageLite::GetTypeName((MessageLite *)&test_type_1_pointer);
    absl::lts_20250127::AlphaNum::AlphaNum(&local_410,local_420);
    absl::lts_20250127::AlphaNum::AlphaNum(&local_450," to ");
    this_00 = proto2_unittest::TestPackedTypesLite::default_instance();
    pc = MessageLite::GetTypeName(&this_00->super_MessageLite);
    absl::lts_20250127::AlphaNum::AlphaNum(&local_480,pc);
    absl::lts_20250127::StrCat_abi_cxx11_
              (&local_3b0,(lts_20250127 *)&local_3e0,&local_410,&local_450,&local_480,in_R9);
    testing::internal::MakeDeathTestMatcher(&local_390,&local_3b0);
    bVar1 = testing::internal::DeathTest::Create
                      ("DownCastMessage<CastType2>(test_type_1_pointer)",&local_390,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/lite_unittest.cc"
                       ,0x5a6,&local_378);
    testing::
    Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~Matcher(&local_390);
    std::__cxx11::string::~string((string *)&local_3b0);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      if (local_378 != (pointer)0x0) {
        std::
        unique_ptr<testing::internal::DeathTest,std::default_delete<testing::internal::DeathTest>>::
        unique_ptr<std::default_delete<testing::internal::DeathTest>,void>
                  ((unique_ptr<testing::internal::DeathTest,std::default_delete<testing::internal::DeathTest>>
                    *)&gtest_sentinel,local_378);
        iVar2 = (*local_378->_vptr_DeathTest[2])();
        if (iVar2 == 0) {
          iVar2 = (*local_378->_vptr_DeathTest[3])();
          bVar1 = testing::internal::ExitedUnsuccessfully(iVar2);
          uVar3 = (*local_378->_vptr_DeathTest[4])(local_378,(ulong)bVar1);
          if ((uVar3 & 1) != 0) goto LAB_00155640;
          local_4cc = 2;
        }
        else {
          if (iVar2 == 1) {
            testing::internal::DeathTest::ReturnSentinel::ReturnSentinel
                      ((ReturnSentinel *)&gtest_exception,local_378);
            bVar1 = testing::internal::AlwaysTrue();
            if (bVar1) {
              DownCastMessage<proto2_unittest::TestPackedTypesLite>(&local_360->super_MessageLite);
            }
            (*local_378->_vptr_DeathTest[5])(local_378,2);
            testing::internal::DeathTest::ReturnSentinel::~ReturnSentinel
                      ((ReturnSentinel *)&gtest_exception);
          }
LAB_00155640:
          local_4cc = 0;
        }
        std::
        unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>
        ::~unique_ptr((unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>
                       *)&gtest_sentinel);
        if (local_4cc != 0) {
          if (local_4cc != 2) goto LAB_00155757;
          goto LAB_00155692;
        }
      }
      local_4cc = 0;
      goto LAB_00155757;
    }
  }
LAB_00155692:
  testing::Message::Message(&local_4d8);
  message = testing::internal::DeathTest::LastMessage();
  testing::internal::AssertHelper::AssertHelper
            (&local_4e0,kFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/lite_unittest.cc"
             ,0x5a6,message);
  testing::internal::AssertHelper::operator=(&local_4e0,&local_4d8);
  testing::internal::AssertHelper::~AssertHelper(&local_4e0);
  testing::Message::~Message(&local_4d8);
  local_4cc = 1;
LAB_00155757:
  proto2_unittest::TestAllTypesLite::~TestAllTypesLite((TestAllTypesLite *)&test_type_1_pointer);
  return;
}

Assistant:

TEST(LiteTest, DownCastMessageInvalidPointerType) {
  CastType1 test_type_1;

  MessageLite* test_type_1_pointer = &test_type_1;

  ASSERT_DEBUG_DEATH(
      DownCastMessage<CastType2>(test_type_1_pointer),
      absl::StrCat("Cannot downcast ", test_type_1.GetTypeName(), " to ",
                   CastType2::default_instance().GetTypeName()));
}